

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

void Catch::anon_unknown_26::writeSourceInfo(JsonObjectWriter *writer,SourceLineInfo *sourceInfo)

{
  JsonObjectWriter source_location_writer;
  JsonValueWriter local_1a8;
  
  JsonObjectWriter::write((JsonObjectWriter *)&local_1a8,(int)writer,"source-location",0xf);
  JsonValueWriter::writeObject(&source_location_writer,&local_1a8);
  std::__cxx11::stringstream::~stringstream((stringstream *)&local_1a8.m_sstream);
  JsonObjectWriter::write((JsonObjectWriter *)&local_1a8,(int)&source_location_writer,"filename",8);
  JsonValueWriter::write<char_const*>(&local_1a8,&sourceInfo->file);
  std::__cxx11::stringstream::~stringstream((stringstream *)&local_1a8.m_sstream);
  JsonObjectWriter::write((JsonObjectWriter *)&local_1a8,(int)&source_location_writer,"line",4);
  JsonValueWriter::write<unsigned_long>(&local_1a8,&sourceInfo->line);
  std::__cxx11::stringstream::~stringstream((stringstream *)&local_1a8.m_sstream);
  JsonObjectWriter::~JsonObjectWriter(&source_location_writer);
  return;
}

Assistant:

void writeSourceInfo( JsonObjectWriter& writer,
                              SourceLineInfo const& sourceInfo ) {
            auto source_location_writer =
                writer.write( "source-location"_sr ).writeObject();
            source_location_writer.write( "filename"_sr )
                .write( sourceInfo.file );
            source_location_writer.write( "line"_sr ).write( sourceInfo.line );
        }